

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs5.c
# Opt level: O0

int pkcs5_parse_pbkdf2_params
              (mbedtls_asn1_buf *params,mbedtls_asn1_buf *salt,int *iterations,int *keylen,
              mbedtls_md_type_t *md_type)

{
  int iVar1;
  uchar *end_00;
  uchar *end;
  uchar *p;
  mbedtls_asn1_buf prf_alg_oid;
  int ret;
  mbedtls_md_type_t *md_type_local;
  int *keylen_local;
  int *iterations_local;
  mbedtls_asn1_buf *salt_local;
  mbedtls_asn1_buf *params_local;
  
  prf_alg_oid.p._4_4_ = 0xffffff92;
  end = params->p;
  end_00 = params->p + params->len;
  if (params->tag == 0x30) {
    prf_alg_oid.p._4_4_ = mbedtls_asn1_get_tag(&end,end_00,&salt->len,4);
    if (prf_alg_oid.p._4_4_ == 0) {
      salt->p = end;
      end = end + salt->len;
      prf_alg_oid.p._4_4_ = mbedtls_asn1_get_int(&end,end_00,iterations);
      if (prf_alg_oid.p._4_4_ == 0) {
        if (end == end_00) {
          params_local._4_4_ = 0;
        }
        else {
          prf_alg_oid.p._4_4_ = mbedtls_asn1_get_int(&end,end_00,keylen);
          if ((prf_alg_oid.p._4_4_ == 0) || (prf_alg_oid.p._4_4_ == -0x62)) {
            if (end == end_00) {
              params_local._4_4_ = 0;
            }
            else {
              prf_alg_oid.p._4_4_ = mbedtls_asn1_get_alg_null(&end,end_00,(mbedtls_asn1_buf *)&p);
              if (prf_alg_oid.p._4_4_ == 0) {
                iVar1 = mbedtls_oid_get_md_hmac((mbedtls_asn1_buf *)&p,md_type);
                if (iVar1 == 0) {
                  if (end == end_00) {
                    params_local._4_4_ = 0;
                  }
                  else {
                    params_local._4_4_ = -0x2f66;
                  }
                }
                else {
                  params_local._4_4_ = -0x2e80;
                }
              }
              else {
                params_local._4_4_ = prf_alg_oid.p._4_4_ + -0x2f00;
              }
            }
          }
          else {
            params_local._4_4_ = prf_alg_oid.p._4_4_ + -0x2f00;
          }
        }
      }
      else {
        params_local._4_4_ = prf_alg_oid.p._4_4_ + -0x2f00;
      }
    }
    else {
      params_local._4_4_ = prf_alg_oid.p._4_4_ + -0x2f00;
    }
  }
  else {
    params_local._4_4_ = -0x2f62;
  }
  return params_local._4_4_;
}

Assistant:

static int pkcs5_parse_pbkdf2_params( const mbedtls_asn1_buf *params,
                                      mbedtls_asn1_buf *salt, int *iterations,
                                      int *keylen, mbedtls_md_type_t *md_type )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_asn1_buf prf_alg_oid;
    unsigned char *p = params->p;
    const unsigned char *end = params->p + params->len;

    if( params->tag != ( MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) )
        return( MBEDTLS_ERR_PKCS5_INVALID_FORMAT +
                MBEDTLS_ERR_ASN1_UNEXPECTED_TAG );
    /*
     *  PBKDF2-params ::= SEQUENCE {
     *    salt              OCTET STRING,
     *    iterationCount    INTEGER,
     *    keyLength         INTEGER OPTIONAL
     *    prf               AlgorithmIdentifier DEFAULT algid-hmacWithSHA1
     *  }
     *
     */
    if( ( ret = mbedtls_asn1_get_tag( &p, end, &salt->len,
                                      MBEDTLS_ASN1_OCTET_STRING ) ) != 0 )
        return( MBEDTLS_ERR_PKCS5_INVALID_FORMAT + ret );

    salt->p = p;
    p += salt->len;

    if( ( ret = mbedtls_asn1_get_int( &p, end, iterations ) ) != 0 )
        return( MBEDTLS_ERR_PKCS5_INVALID_FORMAT + ret );

    if( p == end )
        return( 0 );

    if( ( ret = mbedtls_asn1_get_int( &p, end, keylen ) ) != 0 )
    {
        if( ret != MBEDTLS_ERR_ASN1_UNEXPECTED_TAG )
            return( MBEDTLS_ERR_PKCS5_INVALID_FORMAT + ret );
    }

    if( p == end )
        return( 0 );

    if( ( ret = mbedtls_asn1_get_alg_null( &p, end, &prf_alg_oid ) ) != 0 )
        return( MBEDTLS_ERR_PKCS5_INVALID_FORMAT + ret );

    if( mbedtls_oid_get_md_hmac( &prf_alg_oid, md_type ) != 0 )
        return( MBEDTLS_ERR_PKCS5_FEATURE_UNAVAILABLE );

    if( p != end )
        return( MBEDTLS_ERR_PKCS5_INVALID_FORMAT +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

    return( 0 );
}